

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O1

void run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
               (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *A,vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                   *B)

{
  pointer pfVar1;
  mapped_type *pmVar2;
  pointer ppVar3;
  ulong uVar4;
  key_type local_3c;
  mapped_type local_38;
  
  std::
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  ::resize(B,((long)(A->
                    super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(A->
                    super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pfVar1 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((A->
      super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pfVar1) {
    uVar4 = 0;
    do {
      ppVar3 = pfVar1[uVar4].m_flat_tree.m_data.m_seq.m_holder.m_start;
      pfVar1 = (A->
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (ppVar3 != (pointer)(*(stored_size_type *)
                               ((long)&pfVar1[uVar4].m_flat_tree.m_data.m_seq + 8) * 0x10 +
                             *(long *)&pfVar1[uVar4].m_flat_tree.m_data.m_seq)) {
        do {
          local_38 = ppVar3->second;
          local_3c = (key_type)uVar4;
          pmVar2 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::
                   priv_subscript((B->
                                  super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + ppVar3->first,
                                  &local_3c);
          *pmVar2 = local_38;
          ppVar3 = ppVar3 + 1;
          pfVar1 = (A->
                   super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (ppVar3 != (pointer)(*(stored_size_type *)
                                      ((long)&pfVar1[uVar4].m_flat_tree.m_data.m_seq + 8) * 0x10 +
                                    *(long *)&pfVar1[uVar4].m_flat_tree.m_data.m_seq));
      }
      uVar4 = uVar4 + 1;
      pfVar1 = (A->
               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)(((long)(A->
                                    super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1 >> 3)
                            * -0x5555555555555555));
  }
  do_nothing(B);
  return;
}

Assistant:

void run(std::vector<RowType1> const & A,
         std::vector<RowType2> & B)
{
  B.resize(A.size());

  for (std::size_t i=0; i<A.size(); ++i)
    for (typename RowType1::const_iterator it = A[i].begin(); it != A[i].end(); ++it)
      B[it->first][i] = it->second;

  do_nothing(B);
}